

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

int xp_compute_pk(CHAR_DATA *ch,CHAR_DATA *victim,int members)

{
  float fVar1;
  ushort uVar2;
  short sVar3;
  short sVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  char *astr;
  ulong uVar9;
  uint uVar10;
  float fVar11;
  undefined8 in_XMM1_Qb;
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 local_38 [16];
  
  bVar5 = is_npc(ch);
  if (bVar5) {
    return 0;
  }
  bVar5 = is_npc(victim);
  if (bVar5) {
    return 0;
  }
  astr = ch->pcdata->recentkills[0];
  if (astr != (char *)0x0) {
    uVar9 = 0;
    do {
      bVar5 = false;
      if ((0x5e < uVar9) || (bVar5 = false, *astr == '\0')) goto LAB_002947b3;
      bVar5 = str_cmp(astr,victim->name);
      if (!bVar5) {
        bVar5 = true;
        goto LAB_002947b3;
      }
      astr = ch->pcdata->recentkills[uVar9 + 1];
      uVar9 = uVar9 + 1;
    } while (astr != (char *)0x0);
  }
  bVar5 = false;
LAB_002947b3:
  uVar2 = victim->level;
  iVar7 = (int)(short)uVar2;
  fVar11 = 0.0;
  if (0xe < iVar7) {
    if (uVar2 < 0x14) {
      fVar11 = (float)iVar7;
    }
    else {
      if (uVar2 < 0x19) {
        iVar8 = iVar7 * 2;
      }
      else if (uVar2 < 0x1e) {
        iVar8 = iVar7 * 4;
      }
      else if (uVar2 < 0x23) {
        iVar8 = iVar7 * 8;
      }
      else if (uVar2 < 0x28) {
        iVar8 = iVar7 * 0xc;
      }
      else if (uVar2 < 0x2d) {
        iVar8 = iVar7 << 4;
      }
      else {
        iVar8 = iVar7 * 0x14;
      }
      fVar11 = (float)iVar8;
    }
  }
  auVar12._0_8_ = (double)(iVar7 - ch->level) * 0.05;
  auVar12._8_8_ = in_XMM1_Qb;
  local_38._4_12_ = auVar12._4_12_;
  local_38._0_4_ = ((float)auVar12._0_8_ + 1.0) * fVar11;
  bVar6 = is_good(ch);
  if (bVar6) {
    bVar6 = is_good(victim);
    if (bVar6) {
      send_to_char("With the final strike, you feel a twinge in your soul.\n\r",ch);
      local_38 = ZEXT816(0);
    }
    bVar6 = is_neutral(victim);
    if (bVar6) {
      local_38._0_4_ = (float)local_38._0_4_ * 0.5;
    }
    bVar6 = is_evil(victim);
    if (bVar6) {
      local_38._0_4_ = (float)local_38._0_4_ * 1.25;
    }
    local_38._0_4_ = (float)local_38._0_4_ + (float)(victim->pcdata->kills[1] * 5);
  }
  bVar6 = is_neutral(ch);
  if (bVar6) {
    bVar6 = is_good(victim);
    if (bVar6) {
      sVar3 = ch->pcdata->kills[1];
      sVar4 = ch->pcdata->kills[3];
      if (sVar3 < sVar4) {
        local_38._8_4_ = 0;
        local_38._12_4_ = 0;
        local_38._0_4_ = (float)local_38._0_4_ * 1.2;
      }
      else {
      }
      if (sVar4 < sVar3) {
        local_38._0_4_ = (float)local_38._0_4_ * 0.8;
      }
      local_38._4_4_ = 0;
    }
    bVar6 = is_evil(victim);
    if (bVar6) {
      sVar3 = ch->pcdata->kills[1];
      sVar4 = ch->pcdata->kills[3];
      if (sVar4 < sVar3) {
        local_38._0_4_ = (float)local_38._0_4_ * 1.2;
      }
      if (sVar3 < sVar4) {
        local_38._0_4_ = (float)local_38._0_4_ * 0.8;
      }
      goto LAB_0029499b;
    }
  }
LAB_0029499b:
  if (ch->cabal == 0) {
    if (victim->cabal != 0) {
      local_38._0_4_ = (float)local_38._0_4_ * 1.2;
    }
  }
  else if (victim->cabal == 0) {
    local_38._0_4_ = (float)local_38._0_4_ * 0.8;
  }
  if (bVar5) {
    send_to_char("You have little more to learn from slaying this foe repeatedly.\n\r",ch);
    fVar11 = 0.0;
  }
  else {
    fVar11 = victim->pcdata->frags[0];
    fVar1 = victim->pcdata->fragged;
    fVar13 = fVar11 + fVar1;
    uVar10 = -(uint)(5.0 < fVar13);
    fVar11 = (float)(~uVar10 & local_38._0_4_ |
                    (uint)(((fVar11 - fVar1) / fVar13 + 1.0) * (float)local_38._0_4_) & uVar10) /
             ((float)members * (float)members);
  }
  return (int)fVar11;
}

Assistant:

int xp_compute_pk(CHAR_DATA *ch, CHAR_DATA *victim, int members)
{
	int i;
	float xp, netpk, totalpk;
	bool recentpk = false;

	if (is_npc(ch) || is_npc(victim))
		return 0;

	for (i = 0; ch->pcdata->recentkills[i] && *(ch->pcdata->recentkills[i]) != '\0' && i < 95; i++)
	{
		if (!str_cmp(ch->pcdata->recentkills[i], victim->name))
		{
			recentpk = true;
			break;
		}
	}

	/* We don't want to encourage low-level PKing */

	if (victim->level < 15)
		xp = 0;
	else if (victim->level < 20)
		xp = victim->level;
	else if (victim->level < 25)
		xp = victim->level * 2;
	else if (victim->level < 30)
		xp = victim->level * 4;
	else if (victim->level < 35)
		xp = victim->level * 8;
	else if (victim->level < 40)
		xp = victim->level * 12;
	else if (victim->level < 45)
		xp = victim->level * 16;
	else
		xp = victim->level * 20;

	/* Level mods */

	xp *= (float)(1 + (float)(0.05 * (victim->level - ch->level)));

	/* Alignment mods */

	if (is_good(ch))
	{
		if (is_good(victim))
		{
			send_to_char("With the final strike, you feel a twinge in your soul.\n\r", ch);
			xp = 0;
		}

		if (is_neutral(victim))
			xp /= 2;

		if (is_evil(victim))
			xp *= 1.25;

		xp += 5 * victim->pcdata->kills[PK_GOOD];
	}

	if (is_neutral(ch))
	{
		if (is_good(victim))
		{
			if (ch->pcdata->kills[PK_GOOD] < ch->pcdata->kills[PK_EVIL])
				xp *= 1.2;

			if (ch->pcdata->kills[PK_GOOD] > ch->pcdata->kills[PK_EVIL])
				xp *= 0.8;
		}

		if (is_evil(victim))
		{
			if (ch->pcdata->kills[PK_GOOD] > ch->pcdata->kills[PK_EVIL])
				xp *= 1.2;

			if (ch->pcdata->kills[PK_GOOD] < ch->pcdata->kills[PK_EVIL])
				xp *= 0.8;
		}
	}

	/* Cabal mods */

	if (ch->cabal && !victim->cabal)
		xp *= 0.8;

	if (!ch->cabal && victim->cabal)
		xp *= 1.2;

	/* Victim PK mods */

	netpk = victim->pcdata->frags[PK_KILLS] - victim->pcdata->fragged;
	totalpk = victim->pcdata->frags[PK_KILLS] + victim->pcdata->fragged;

	if (totalpk > 5)
		xp *= (1 + (netpk / totalpk));

	/* We do not reward gangbanging */

	xp /= pow(members, 2);

	/* We do not reward multikilling */

	if (recentpk)
	{
		xp = 0;
		send_to_char("You have little more to learn from slaying this foe repeatedly.\n\r", ch);
	}

	return (int)xp;
}